

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall vec3<unsigned_int>::normalize(vec3<unsigned_int> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  
  uVar1 = (this->super_vec3_base).r;
  uVar3 = (this->super_vec3_base).g;
  fVar5 = (this->super_vec3_base).b;
  if (((((float)uVar1 == 2.1474836e+09) && (!NAN((float)uVar1))) && ((float)uVar3 == 2.1474836e+09))
     && (((!NAN((float)uVar3) && (fVar5 == 2.1474836e+09)) && (!NAN(fVar5))))) {
    return;
  }
  auVar7._0_8_ = (double)(float)uVar1;
  auVar7._8_8_ = (double)(float)uVar3;
  auVar7 = divpd(auVar7,_DAT_00155230);
  (this->super_vec3_base).r = (float)auVar7._0_8_ + (float)auVar7._0_8_ + -1.0;
  (this->super_vec3_base).g = (float)auVar7._8_8_ + (float)auVar7._8_8_ + -1.0;
  (this->super_vec3_base).b = fVar5 / 4.2949673e+09 + fVar5 / 4.2949673e+09 + -1.0;
  vec3_base::clamp(&this->super_vec3_base,-1.0,1.0);
  vec3_base::base_normalize(&this->super_vec3_base);
  uVar2 = (this->super_vec3_base).r;
  uVar4 = (this->super_vec3_base).g;
  fVar5 = floorf(((float)uVar2 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
  fVar6 = floorf(((float)uVar4 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
  (this->super_vec3_base).r = fVar5;
  (this->super_vec3_base).g = fVar6;
  fVar5 = floorf(((this->super_vec3_base).b + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
  (this->super_vec3_base).b = fVar5;
  vec3_base::clamp(&this->super_vec3_base,0.0,4.2949673e+09);
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }